

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

BinsSelectExpr *
slang::ast::BinSelectWithFilterExpr::fromSyntax
          (BinSelectWithFilterExprSyntax *syntax,ASTContext *context)

{
  long lVar1;
  BinSelectWithFilterExprSyntax *pBVar2;
  TempVarSymbol *pTVar3;
  bool bVar4;
  int iVar5;
  Compilation *this;
  BinsSelectExpressionSyntax *pBVar6;
  undefined4 extraout_var;
  Scope *pSVar7;
  CoverCrossSymbol *pCVar8;
  Type *pTVar9;
  ExpressionSyntax *pEVar10;
  Expression *expr;
  SyntaxNode *this_00;
  ExpressionPatternSyntax *pEVar11;
  Expression *this_01;
  BinSelectWithFilterExpr *pBVar12;
  socklen_t __len;
  long lVar13;
  TempVarSymbol *__old_val;
  Expression *matches;
  ASTContext iterCtx;
  Expression *local_90;
  BinSelectWithFilterExprSyntax *local_88;
  BinsSelectExpr *local_80;
  pointer local_78;
  long local_70;
  ASTContext local_68;
  
  this = ASTContext::getCompilation(context);
  local_88 = syntax;
  pBVar6 = not_null<slang::syntax::BinsSelectExpressionSyntax_*>::get(&syntax->expr);
  iVar5 = BinsSelectExpr::bind((int)pBVar6,(sockaddr *)context,__len);
  local_80 = (BinsSelectExpr *)CONCAT44(extraout_var,iVar5);
  local_68.assertionInstance = context->assertionInstance;
  local_68.scope.ptr = (context->scope).ptr;
  local_68.lookupIndex = context->lookupIndex;
  local_68._12_4_ = *(undefined4 *)&context->field_0xc;
  local_68.flags.m_bits = (context->flags).m_bits;
  local_68.instanceOrProc = context->instanceOrProc;
  local_68.firstTempVar = context->firstTempVar;
  local_68.randomizeDetails = context->randomizeDetails;
  pSVar7 = not_null<const_slang::ast::Scope_*>::get(&context->scope);
  pCVar8 = Symbol::as<slang::ast::CoverCrossSymbol>(pSVar7->thisSym->parentScope->thisSym);
  local_78 = (pCVar8->targets).data_;
  local_70 = (pCVar8->targets).size_ << 3;
  for (lVar13 = 0; pTVar3 = local_68.firstTempVar, pBVar2 = local_88, local_70 != lVar13;
      lVar13 = lVar13 + 8) {
    lVar1 = *(long *)((long)local_78 + lVar13);
    pSVar7 = not_null<const_slang::ast::Scope_*>::get(&context->scope);
    pTVar9 = DeclaredType::getType((DeclaredType *)(lVar1 + 0x70));
    local_68.firstTempVar =
         &BumpAllocator::
          emplace<slang::ast::IteratorSymbol,slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,slang::ast::Type_const&>
                    (&this->super_BumpAllocator,pSVar7,
                     (basic_string_view<char,_std::char_traits<char>_> *)(lVar1 + 8),
                     (SourceLocation *)(lVar1 + 0x18),pTVar9)->super_TempVarSymbol;
    (((IteratorSymbol *)local_68.firstTempVar)->super_TempVarSymbol).nextTemp = pTVar3;
  }
  pEVar10 = not_null<slang::syntax::ExpressionSyntax_*>::get(&local_88->filter);
  expr = bindCovergroupExpr(pEVar10,&local_68,(Type *)0x0,(bitmask<slang::ast::ASTFlags>)0x0);
  ASTContext::requireBooleanConvertible(&local_68,expr);
  local_90 = (Expression *)0x0;
  if (pBVar2->matchesClause != (MatchesClauseSyntax *)0x0) {
    this_00 = &not_null<slang::syntax::PatternSyntax_*>::get(&pBVar2->matchesClause->pattern)->
               super_SyntaxNode;
    pEVar11 = slang::syntax::SyntaxNode::as<slang::syntax::ExpressionPatternSyntax>(this_00);
    pEVar10 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pEVar11->expr);
    this_01 = bindCovergroupExpr(pEVar10,context,(Type *)0x0,(bitmask<slang::ast::ASTFlags>)0x800);
    local_90 = this_01;
    bVar4 = Expression::bad(this_01);
    if (!bVar4) {
      pTVar9 = not_null<const_slang::ast::Type_*>::get(&this_01->type);
      bVar4 = Type::isUnbounded(pTVar9);
      if (!bVar4) {
        ASTContext::requireIntegral(context,this_01);
      }
    }
  }
  pBVar12 = BumpAllocator::
            emplace<slang::ast::BinSelectWithFilterExpr,slang::ast::BinsSelectExpr_const&,slang::ast::Expression_const&,slang::ast::Expression_const*&>
                      (&this->super_BumpAllocator,local_80,expr,&local_90);
  return &pBVar12->super_BinsSelectExpr;
}

Assistant:

BinsSelectExpr& BinSelectWithFilterExpr::fromSyntax(const BinSelectWithFilterExprSyntax& syntax,
                                                    const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& expr = bind(*syntax.expr, context);

    // Create the iterator variables for all of the parent cross items
    // and then bind the filter expression.
    ASTContext iterCtx = context;

    auto& cross = context.scope->asSymbol().getParentScope()->asSymbol().as<CoverCrossSymbol>();
    for (auto target : cross.targets) {
        auto it = comp.emplace<IteratorSymbol>(*context.scope, target->name, target->location,
                                               target->getType());
        it->nextTemp = std::exchange(iterCtx.firstTempVar, it);
    }

    auto& filter = bindCovergroupExpr(*syntax.filter, iterCtx);
    iterCtx.requireBooleanConvertible(filter);

    const Expression* matches = nullptr;
    if (syntax.matchesClause) {
        matches =
            &bindCovergroupExpr(*syntax.matchesClause->pattern->as<ExpressionPatternSyntax>().expr,
                                context, nullptr, ASTFlags::AllowUnboundedLiteral);
        if (!matches->bad() && !matches->type->isUnbounded())
            context.requireIntegral(*matches);
    }

    return *comp.emplace<BinSelectWithFilterExpr>(expr, filter, matches);
}